

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O1

RC __thiscall
QO_Manager::ApplyGTCond
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,int condIdx,float *numTuples)

{
  float fVar1;
  float fVar2;
  int iVar3;
  RC RVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  QO_Manager *pQVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int idx;
  int idx2;
  float value;
  int local_3c;
  int local_38;
  float local_34;
  
  RVar4 = CondToAttrIdx(this,condIdx,&local_3c,&local_38);
  iVar3 = local_3c;
  if (RVar4 == 0) {
    pQVar7 = (QO_Manager *)attr_stats;
    if (this->conds[condIdx].bRhsIsAttr == 0) {
      ConvertValueToFloat(this,condIdx,&local_34);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar10 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar8 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar8 = ((fVar10 - local_34) + 1.0) / ((fVar8 - pmVar5->minValue) + 2.0);
      *numTuples = *numTuples * fVar8;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar10 = pmVar5->numTuples;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar5->numTuples = fVar8 * fVar10;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
    }
    else {
      local_3c = local_38;
      local_38 = iVar3;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar6 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar10 = pmVar6->maxValue;
      if (pmVar5->maxValue <= pmVar6->maxValue) {
        fVar10 = pmVar5->maxValue;
      }
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar6 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar8 = pmVar6->minValue;
      if (pmVar6->minValue <= pmVar5->minValue) {
        fVar8 = pmVar5->minValue;
      }
      fVar8 = (fVar8 + fVar10) * 0.5;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar9 = (pmVar5->maxValue - fVar8) + 1.0;
      fVar10 = 0.0;
      if (0.0 <= fVar9) {
        fVar10 = fVar9;
      }
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar9 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar10 = fVar10 / ((fVar9 - pmVar5->minValue) + 1.0);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar9 = (fVar8 - pmVar5->minValue) + 1.0;
      fVar8 = 0.0;
      if (0.0 <= fVar9) {
        fVar8 = fVar9;
      }
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar9 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar8 = fVar8 / ((fVar9 - pmVar5->minValue) + 1.0);
      if (fVar10 <= fVar8) {
        fVar10 = fVar8;
      }
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar6 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar8 = pmVar6->maxValue;
      if (pmVar5->maxValue <= pmVar6->maxValue) {
        fVar8 = pmVar5->maxValue;
      }
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar6 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      local_34 = pmVar6->minValue;
      if (pmVar5->minValue <= pmVar6->minValue) {
        local_34 = pmVar5->minValue;
      }
      *numTuples = fVar10 * *numTuples;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar10 = pmVar5->numTuples;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar9 = pmVar5->minValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar1 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar2 = pmVar5->minValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar5->numTuples = (((fVar8 - fVar9) + 1.0) * fVar10) / ((fVar1 - fVar2) + 2.0);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      fVar10 = pmVar5->numTuples;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar9 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar1 = pmVar5->maxValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      fVar2 = pmVar5->minValue;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_38);
      pmVar5->numTuples = ((fVar9 - local_34) * fVar10) / ((fVar1 - fVar2) + 2.0);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar5->maxValue = fVar8;
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
    }
    pmVar5->minValue = local_34;
    NormalizeStats(pQVar7,attr_stats,local_34,*numTuples,local_3c,local_38);
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

RC QO_Manager::ApplyGTCond(map<int, attrStat> &attr_stats, int condIdx, float& numTuples){
  RC rc = 0;
  // Retrieves the indices of the condition attributes
  int idx, idx2;
  if((rc = CondToAttrIdx(condIdx, idx, idx2)))
    return (rc);
  float frac = 0.0;
  if(conds[condIdx].bRhsIsAttr){
    swap(idx, idx2); // the following is the same as LT, except attr indices are swapped
    float mid = 0.5*(min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue) + 
      max(attr_stats[idx].minValue, attr_stats[idx2].minValue));
    float fracS = max(attr_stats[idx2].maxValue - mid + 1, (float)0.0) / 
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 1);
    float fracR = max(mid - attr_stats[idx].minValue + 1, (float)0.0) / 
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 1);
    float newMaxR = min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue);
    float newMinS = min(attr_stats[idx].minValue, attr_stats[idx2].minValue);
    numTuples = numTuples * max(fracR, fracS);
    attr_stats[idx].numTuples = attr_stats[idx].numTuples*(newMaxR - attr_stats[idx].minValue + 1)/
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    attr_stats[idx2].numTuples = attr_stats[idx].numTuples*(attr_stats[idx2].maxValue - newMinS)/
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 2);
    attr_stats[idx].maxValue = newMaxR;
    attr_stats[idx].minValue = newMinS;
    frac = max(fracR, fracS);
  }
  else{
    float value;
    ConvertValueToFloat(condIdx, value); // get the min value
    // calculate the fraction of values expected to survive the condition. assume
    // that values for relation are evenly distributed
    float fracR = (attr_stats[idx].maxValue - value + 1)/(attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    // update values
    numTuples = numTuples*fracR; 
    attr_stats[idx].numTuples = attr_stats[idx].numTuples * fracR;
    attr_stats[idx].minValue = value;
    frac = fracR;
  }
  // Normalize non-join attributes
  NormalizeStats(attr_stats, frac, numTuples, idx, idx2);
  return (0);
}